

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlen.c
# Opt level: O3

_Bool ptrlen_contains(ptrlen input,char *characters)

{
  char *pcVar1;
  char *p;
  char *pcVar2;
  bool bVar3;
  
  if ((long)input.len < 1) {
    return false;
  }
  pcVar1 = (char *)input.ptr;
  do {
    pcVar2 = pcVar1 + 1;
    pcVar1 = strchr(characters,(int)*pcVar1);
    bVar3 = pcVar1 != (char *)0x0;
    if (bVar3) {
      return bVar3;
    }
    pcVar1 = pcVar2;
  } while (pcVar2 < (char *)((long)input.ptr + input.len));
  return bVar3;
}

Assistant:

bool ptrlen_contains(ptrlen input, const char *characters)
{
    for (const char *p = input.ptr, *end = p + input.len; p < end; p++)
        if (strchr(characters, *p))
            return true;
    return false;
}